

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::trim(string *__return_storage_ptr__,string *str)

{
  size_type __pos;
  size_type sVar1;
  
  __pos = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of(str,"\n\r\t ",0,4);
  sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(str,"\n\r\t ",0xffffffffffffffff,4);
  if (__pos == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,str,__pos,(sVar1 - __pos) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim(std::string const &str) {
    static char const *whitespaceChars = "\n\r\t ";
    std::string::size_type start = str.find_first_not_of(whitespaceChars);
    std::string::size_type end = str.find_last_not_of(whitespaceChars);

    return start != std::string::npos ? str.substr(start, 1 + end - start) : std::string();
  }